

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separator.h
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
flow_cutter::ComputeSeparator::operator()
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ComputeSeparator *this,
          ArrayIDIDFunc *tail,ArrayIDIDFunc *head,int max_separator_size)

{
  int node_count;
  int iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ArrayIDIDFunc *tail_00;
  bool bVar9;
  long lVar10;
  ulong uVar11;
  pointer pSVar12;
  int iVar13;
  undefined4 in_register_00000084;
  ArrayIDIDFunc *tail_01;
  int iVar14;
  pointer piVar15;
  byte bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [32];
  vector<int,_std::allocator<int>_> *separator;
  RangeIDIDMultiFunc out_arc;
  ArrayIDIDFunc back_arc;
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  expanded_graph;
  Separator local_1c8;
  ArrayIDIDFunc *local_1a0;
  pointer local_198;
  pointer piStack_190;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> local_188;
  undefined1 local_168 [16];
  pointer local_158;
  undefined1 local_148 [16];
  pointer piStack_138;
  ArrayIDIDFunc *local_130;
  double local_128;
  double local_120;
  vector<int,_std::allocator<int>_> local_118;
  undefined1 local_100 [16];
  undefined1 local_f0 [24];
  vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  local_d8;
  int local_c0;
  int local_bc;
  long local_b8;
  int local_b0;
  undefined8 local_ac;
  undefined8 uStack_a4;
  undefined8 local_9c;
  ArrayIDIDFunc local_90;
  Capacity local_78;
  ArrayIDIDFunc *local_70;
  Capacity local_68;
  ArrayIDIDFunc *local_60;
  Capacity local_58;
  ArrayIDIDFunc *local_50;
  Capacity local_48;
  Capacity local_40;
  ArrayIDIDFunc *local_38;
  
  auVar22 = in_ZMM2._0_16_;
  node_count = tail->image_count_;
  iVar13 = max_separator_size;
  invert_sorted_id_id_func<ArrayIDIDFunc>((ArrayIDIDFunc *)local_100);
  compute_back_arc_permutation<ArrayIDIDFunc,ArrayIDIDFunc>(&local_90,tail,head);
  iVar14 = tail->image_count_;
  local_78.original_arc_count = (tail->super_ArrayIDFunc<int>).preimage_count_;
  local_78.original_node_count = iVar14;
  local_f0._0_8_ = &local_78;
  lVar10 = *(long *)&this->config;
  local_f0._8_4_ = iVar14 * 2;
  local_1a0 = head;
  local_70 = tail;
  local_68 = local_78;
  local_60 = head;
  local_58 = local_78;
  local_50 = &local_90;
  local_48 = local_78;
  local_40 = local_78;
  local_38 = (ArrayIDIDFunc *)local_100;
  if (iVar14 == 0) {
    local_f0._16_8_ = (int *)0x0;
  }
  else {
    uVar11 = 0xffffffffffffffff;
    if (-1 < iVar14) {
      uVar11 = (ulong)(uint)local_f0._8_4_ << 2;
    }
    local_f0._16_8_ = operator_new__(uVar11);
  }
  tail_01 = local_1a0;
  local_d8.
  super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ac._0_4_ = (this->config).min_small_side_size;
  local_ac._4_4_ = (this->config).skip_non_maximum_sides;
  uStack_a4._0_4_ = (this->config).separator_selection;
  uStack_a4._4_4_ = (this->config).graph_search_algorithm;
  local_9c._0_4_ = (this->config).avoid_augmenting_path;
  local_9c._4_4_ = (this->config).pierce_rating;
  local_188.
  super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = lVar10;
  local_b0 = max_separator_size;
  if ((int)lVar10 < 1) {
    local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)compute_distant_node_pair<ArrayIDIDFunc,ArrayIDIDFunc>(tail,local_1a0);
    std::vector<flow_cutter::SourceTargetPair,std::allocator<flow_cutter::SourceTargetPair>>::
    _M_assign_aux<flow_cutter::SourceTargetPair_const*>
              ((vector<flow_cutter::SourceTargetPair,std::allocator<flow_cutter::SourceTargetPair>>
                *)&local_188,&local_1c8);
  }
  else {
    select_random_source_target_pairs
              ((vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                *)&local_1c8,node_count,(int)lVar10,(int)((ulong)lVar10 >> 0x20));
    pSVar12 = local_188.
              super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_188.
    super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_188.
    super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_188.
    super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pSVar12 != (pointer)0x0) {
      operator_delete(pSVar12);
      if ((pointer)local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::vector
            ((vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
              *)local_168,&local_188);
  if (local_168._0_8_ != local_168._8_8_) {
    auVar17 = vpbroadcastq_avx512vl();
    auVar21 = vpsrlq_avx2(auVar17,3);
    uVar11 = 0;
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar4 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar22 = auVar4._0_16_;
    auVar17 = vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
    auVar24._8_4_ = 1;
    auVar24._0_8_ = 0x100000001;
    auVar24._12_4_ = 1;
    auVar24._16_4_ = 1;
    auVar24._20_4_ = 1;
    auVar24._24_4_ = 1;
    auVar24._28_4_ = 1;
    auVar2 = vpmovsxbd_avx2(ZEXT816(0x3c342c241c140c04));
    pSVar12 = (pointer)local_168._0_8_;
    do {
      auVar18 = vpbroadcastq_avx512vl();
      auVar19 = vpor_avx2(auVar18,auVar3);
      auVar18 = vpor_avx2(auVar18,auVar4);
      uVar5 = vpcmpuq_avx512vl(auVar18,auVar21,2);
      bVar8 = (byte)uVar5;
      bVar16 = bVar8 & 0xf;
      uVar5 = vpcmpuq_avx512vl(auVar19,auVar21,2);
      bVar7 = (byte)uVar5;
      bVar6 = bVar7 << 4;
      auVar19 = vpgatherdd_avx512vl(*(undefined4 *)((long)&pSVar12->source + lVar10));
      auVar18._4_4_ = (uint)((bVar8 & 2) >> 1) * auVar19._4_4_;
      auVar18._0_4_ = (uint)(bVar8 & 1) * auVar19._0_4_;
      auVar18._8_4_ = (uint)((bVar8 & 4) >> 2) * auVar19._8_4_;
      auVar18._12_4_ = (uint)(bVar16 >> 3) * auVar19._12_4_;
      auVar18._16_4_ = (uint)(bVar7 & 1) * auVar19._16_4_;
      auVar18._20_4_ = (uint)(bVar6 >> 5 & 1) * auVar19._20_4_;
      auVar18._24_4_ = (uint)(bVar6 >> 6 & 1) * auVar19._24_4_;
      auVar18._28_4_ = (uint)(bVar6 >> 7) * auVar19._28_4_;
      auVar19 = vpaddd_avx2(auVar18,auVar18);
      vpscatterdd_avx512vl(ZEXT832(pSVar12) + auVar17,(ulong)(bVar16 | bVar6),auVar19);
      auVar19 = vpgatherdd_avx512vl(*(undefined4 *)((long)&pSVar12->target + lVar10));
      auVar20._4_4_ = (uint)((bVar8 & 2) >> 1) * auVar19._4_4_;
      auVar20._0_4_ = (uint)(bVar8 & 1) * auVar19._0_4_;
      auVar20._8_4_ = (uint)((bVar8 & 4) >> 2) * auVar19._8_4_;
      auVar20._12_4_ = (uint)(bVar16 >> 3) * auVar19._12_4_;
      auVar20._16_4_ = (uint)(bVar7 & 1) * auVar19._16_4_;
      auVar20._20_4_ = (uint)(bVar6 >> 5 & 1) * auVar19._20_4_;
      auVar20._24_4_ = (uint)(bVar6 >> 6 & 1) * auVar19._24_4_;
      auVar20._28_4_ = (uint)(bVar6 >> 7) * auVar19._28_4_;
      auVar19 = vpaddd_avx2(auVar20,auVar20);
      auVar19 = vpor_avx2(auVar19,auVar24);
      vpscatterdd_avx512vl(ZEXT832(pSVar12) + auVar2,(ulong)(bVar16 | bVar6),auVar19);
      uVar11 = uVar11 + 8;
      pSVar12 = pSVar12 + 8;
    } while ((((ulong)(local_168._8_8_ + (-8 - local_168._0_8_)) >> 3) + 8 & 0xfffffffffffffff8) !=
             uVar11);
  }
  local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_168._0_8_;
  local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_168._8_8_;
  local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &local_158->source;
  local_168 = (undefined1  [16])0x0;
  local_158 = (pointer)0x0;
  auVar23 = ZEXT1664(auVar22);
  SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
  ::init((SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
          *)local_f0,(EVP_PKEY_CTX *)&local_1c8);
  if ((pointer)local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_130 = tail;
  if ((pointer)local_168._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128 = 1.0 / (double)node_count;
  local_198 = (pointer)0x7fefffffffffffff;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar15 = (pointer)0x0;
  do {
    tail_00 = local_130;
    lVar10 = (long)local_bc;
    iVar14 = local_d8.
             super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar10].cutter.reachable[0].node_set.
             node_count_inside_;
    if ((iVar14 == local_d8.
                   super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar10].cutter.assimilated[0].node_set.
                   node_count_inside_) &&
       (iVar1 = local_d8.
                super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar10].cutter.assimilated[1].node_set.
                node_count_inside_,
       iVar14 <= iVar1 ||
       local_d8.
       super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar10].cutter.reachable[1].node_set.
       node_count_inside_ != iVar1)) {
      iVar14 = 0;
    }
    else {
      iVar14 = 1;
    }
    iVar14 = (int)((ulong)(*(long *)((long)&local_d8.
                                            super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar10].cutter
                                            .assimilated[0].front.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish +
                                    (ulong)(uint)(iVar14 << 6)) -
                          *(long *)((long)&local_d8.
                                           super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar10].cutter.
                                           assimilated[0].front.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start +
                                   (ulong)(uint)(iVar14 << 6))) >> 2);
    if (max_separator_size < iVar14) break;
    if (node_count - iVar14 < local_c0 * 4) {
      local_120 = (double)local_c0;
      if ((double)iVar14 / local_120 < (double)local_198) {
        flow_cutter::expanded_graph::
        extract_original_separator<ArrayIDIDFunc,ArrayIDIDFunc,flow_cutter::SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>>
                  (&local_1c8,(expanded_graph *)local_130,tail_01,(ArrayIDIDFunc *)local_f0,
                   (SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
                    *)CONCAT44(in_register_00000084,iVar13));
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _0_16_ = ZEXT816(0);
        local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        remove_nodes_from_separator_as_long_as_result_is_balanced<ArrayIDIDFunc,ArrayIDIDFunc>
                  ((vector<int,_std::allocator<int>_> *)local_148,tail_00,tail_01,&local_118);
        uVar5 = local_148._0_8_;
        local_198 = (pointer)local_148._8_8_;
        piStack_190 = piStack_138;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = piStack_138;
        local_148 = ZEXT816(0) << 0x20;
        piStack_138 = (pointer)0x0;
        if (piVar15 != (pointer)0x0) {
          operator_delete(piVar15);
          if ((pointer)local_148._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_148._0_8_);
          }
        }
        if ((pointer)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pointer)local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        auVar22 = vcvtusi2sd_avx512f(auVar23._0_16_,(long)local_198 - uVar5 >> 2);
        local_198 = (pointer)(auVar22._0_8_ / local_120);
        tail_01 = local_1a0;
        piVar15 = (pointer)uVar5;
      }
      if ((double)local_198 <= (double)(iVar14 + 1) * local_128) break;
    }
    bVar9 = SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
            ::advance((SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
                       *)local_f0);
  } while (bVar9);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = piVar15;
  if (local_188.
      super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>::
  ~vector(&local_d8);
  if ((int *)local_f0._16_8_ != (int *)0x0) {
    operator_delete__((void *)local_f0._16_8_);
  }
  if (local_90.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_90.super_ArrayIDFunc<int>.data_);
  }
  if ((int *)local_100._8_8_ != (int *)0x0) {
    operator_delete__((void *)local_100._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> operator()(const Tail& tail, const Head& head, int max_separator_size) const
    {

        const int node_count = tail.image_count();
        const int arc_count = tail.preimage_count();
        (void)arc_count;

        auto out_arc = invert_sorted_id_id_func(tail);
        auto back_arc = compute_back_arc_permutation(tail, head);

        auto expanded_graph = expanded_graph::make_graph(
            make_const_ref_id_id_func(tail), make_const_ref_id_id_func(head),
            make_const_ref_id_id_func(back_arc), make_const_ref_id_func(out_arc));

        Config my_config = config;
        my_config.max_cut_size = max_separator_size;

        auto cutter = make_simple_cutter(expanded_graph, my_config);
        std::vector<SourceTargetPair> pairs;
        if (config.cutter_count > 0)
            pairs = select_random_source_target_pairs(node_count, config.cutter_count, config.random_seed);
        else
            pairs = { compute_distant_node_pair(tail, head) };

        cutter.init(expanded_graph::expand_source_target_pair_list(pairs),
            config.random_seed);

        int balance_num, balance_div;
        switch (((unsigned)config.random_seed * (unsigned)node_count) % 3) {
        case 0:
            balance_num = 1;
            balance_div = 3;
        case 1:
            balance_num = 2;
            balance_div = 5;
        case 2:
            balance_num = 1;
            balance_div = 4;
        }

        double best_score = std::numeric_limits<double>::max();
        std::vector<int> separator;

        for (;;) {
            int cut_size = cutter.get_current_cut().size();
            int small_side_size = cutter.get_current_smaller_cut_side_size();

            if (cut_size > max_separator_size)
                break;

            

            if (balance_div * small_side_size > balance_num * (node_count - cut_size)) {

                double score = (double)cut_size / (double)small_side_size;
                if (score < best_score) {
                    separator = remove_nodes_from_separator_as_long_as_result_is_balanced(tail, head, expanded_graph::extract_original_separator(tail, head, cutter).sep);
                    score = (double)separator.size() / (double)small_side_size;
                    best_score = score;
                }

                double potential_best_next_score = (double)(cut_size + 1) / (double)(expanded_graph::expanded_node_count(node_count) / 2);
                if (potential_best_next_score >= best_score)
                    break;
            }

            if (!cutter.advance())
                break;
        }

        return separator;
    }